

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passes.hpp
# Opt level: O3

Program __thiscall MemoryManagement::run(MemoryManagement *this,Program *program)

{
  mapped_type pFVar1;
  Expression *pEVar2;
  Function *this_00;
  mapped_type *ppFVar3;
  Function *extraout_RDX;
  Expression *expression;
  Function *pFVar4;
  Program PVar5;
  Function *function_1;
  Function *function;
  FunctionTable function_table;
  Function *local_120;
  Function *local_118;
  Function *local_110;
  _Rb_tree_node_base local_108;
  size_t local_e8;
  _Rb_tree<const_Block_*,_std::pair<const_Block_*const,_std::vector<const_Expression_*,_std::allocator<const_Expression_*>_>_>,_std::_Select1st<std::pair<const_Block_*const,_std::vector<const_Expression_*,_std::allocator<const_Expression_*>_>_>_>,_std::less<const_Block_*>,_std::allocator<std::pair<const_Block_*const,_std::vector<const_Expression_*,_std::allocator<const_Expression_*>_>_>_>_>
  local_e0;
  _Rb_tree<const_Expression_*,_std::pair<const_Expression_*const,_unsigned_long>,_std::_Select1st<std::pair<const_Expression_*const,_unsigned_long>_>,_std::less<const_Expression_*>,_std::allocator<std::pair<const_Expression_*const,_unsigned_long>_>_>
  local_b0;
  undefined **local_80;
  UsageTable *local_78;
  Block *local_70;
  undefined8 local_68;
  _Rb_tree<const_Function_*,_std::pair<const_Function_*const,_Function_*>,_std::_Select1st<std::pair<const_Function_*const,_Function_*>_>,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
  local_60;
  
  (this->super_Visitor<const_Expression_*>)._vptr_Visitor = (_func_int **)0x0;
  this->function_table = (FunctionTable *)0x0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  pFVar4 = program->first;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pFVar4 != (Function *)0x0) {
    do {
      local_110 = pFVar4;
      this_00 = (Function *)operator_new(0x60);
      Function::Function(this_00,&pFVar4->argument_types,pFVar4->return_type);
      if ((this->super_Visitor<const_Expression_*>)._vptr_Visitor == (_func_int **)0x0) {
        (this->super_Visitor<const_Expression_*>)._vptr_Visitor = (_func_int **)this_00;
      }
      if (this->function_table != (FunctionTable *)0x0) {
        this->function_table[1]._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this_00;
      }
      this->function_table = (FunctionTable *)this_00;
      ppFVar3 = std::
                map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
                ::operator[]((map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
                              *)&local_60,(key_type *)&local_110);
      *ppFVar3 = this_00;
      pFVar4 = pFVar4->next_function;
    } while (pFVar4 != (Function *)0x0);
    pFVar4 = program->first;
    if (pFVar4 != (Function *)0x0) {
      local_118 = (Function *)this;
      do {
        local_120 = pFVar4;
        ppFVar3 = std::
                  map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
                  ::operator[]((map<const_Function_*,_Function_*,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
                                *)&local_60,&local_120);
        pFVar1 = *ppFVar3;
        local_108._M_color = _S_red;
        local_108._M_parent = (_Base_ptr)0x0;
        local_108._M_left = &local_108;
        local_e8 = 0;
        local_e0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_e0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_e0._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_e0._M_impl.super__Rb_tree_header._M_header;
        local_e0._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_b0._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_b0._M_impl.super__Rb_tree_header._M_header;
        local_b0._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_108._M_right = local_108._M_left;
        local_e0._M_impl.super__Rb_tree_header._M_header._M_right =
             local_e0._M_impl.super__Rb_tree_header._M_header._M_left;
        local_b0._M_impl.super__Rb_tree_header._M_header._M_right =
             local_b0._M_impl.super__Rb_tree_header._M_header._M_left;
        UsageAnalysis1::evaluate((UsageTable *)&local_110,&local_120->block,1);
        local_70 = &local_120->block;
        local_80 = &PTR_visit_int_literal_00154a88;
        local_68 = 1;
        local_78 = (UsageTable *)&local_110;
        for (pEVar2 = (local_120->block).first; pEVar2 != (Expression *)0x0;
            pEVar2 = pEVar2->next_expression) {
          (*pEVar2->_vptr_Expression[2])(pEVar2,&local_80);
        }
        evaluate((FunctionTable *)&local_60,(UsageTable *)&local_110,&pFVar1->block,
                 &local_120->block);
        std::
        _Rb_tree<const_Expression_*,_std::pair<const_Expression_*const,_unsigned_long>,_std::_Select1st<std::pair<const_Expression_*const,_unsigned_long>_>,_std::less<const_Expression_*>,_std::allocator<std::pair<const_Expression_*const,_unsigned_long>_>_>
        ::~_Rb_tree(&local_b0);
        std::
        _Rb_tree<const_Block_*,_std::pair<const_Block_*const,_std::vector<const_Expression_*,_std::allocator<const_Expression_*>_>_>,_std::_Select1st<std::pair<const_Block_*const,_std::vector<const_Expression_*,_std::allocator<const_Expression_*>_>_>_>,_std::less<const_Block_*>,_std::allocator<std::pair<const_Block_*const,_std::vector<const_Expression_*,_std::allocator<const_Expression_*>_>_>_>_>
        ::~_Rb_tree(&local_e0);
        std::
        _Rb_tree<const_Block_*,_std::pair<const_Block_*const,_std::map<const_Expression_*,_std::pair<const_Expression_*,_unsigned_long>,_std::less<const_Expression_*>,_std::allocator<std::pair<const_Expression_*const,_std::pair<const_Expression_*,_unsigned_long>_>_>_>_>,_std::_Select1st<std::pair<const_Block_*const,_std::map<const_Expression_*,_std::pair<const_Expression_*,_unsigned_long>,_std::less<const_Expression_*>,_std::allocator<std::pair<const_Expression_*const,_std::pair<const_Expression_*,_unsigned_long>_>_>_>_>_>,_std::less<const_Block_*>,_std::allocator<std::pair<const_Block_*const,_std::map<const_Expression_*,_std::pair<const_Expression_*,_unsigned_long>,_std::less<const_Expression_*>,_std::allocator<std::pair<const_Expression_*const,_std::pair<const_Expression_*,_unsigned_long>_>_>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<const_Block_*,_std::pair<const_Block_*const,_std::map<const_Expression_*,_std::pair<const_Expression_*,_unsigned_long>,_std::less<const_Expression_*>,_std::allocator<std::pair<const_Expression_*const,_std::pair<const_Expression_*,_unsigned_long>_>_>_>_>,_std::_Select1st<std::pair<const_Block_*const,_std::map<const_Expression_*,_std::pair<const_Expression_*,_unsigned_long>,_std::less<const_Expression_*>,_std::allocator<std::pair<const_Expression_*const,_std::pair<const_Expression_*,_unsigned_long>_>_>_>_>_>,_std::less<const_Block_*>,_std::allocator<std::pair<const_Block_*const,_std::map<const_Expression_*,_std::pair<const_Expression_*,_unsigned_long>,_std::less<const_Expression_*>,_std::allocator<std::pair<const_Expression_*const,_std::pair<const_Expression_*,_unsigned_long>_>_>_>_>_>_>
                     *)&local_110);
        pFVar4 = pFVar4->next_function;
        this = (MemoryManagement *)local_118;
      } while (pFVar4 != (Function *)0x0);
    }
  }
  std::
  _Rb_tree<const_Function_*,_std::pair<const_Function_*const,_Function_*>,_std::_Select1st<std::pair<const_Function_*const,_Function_*>_>,_std::less<const_Function_*>,_std::allocator<std::pair<const_Function_*const,_Function_*>_>_>
  ::~_Rb_tree(&local_60);
  PVar5.last = extraout_RDX;
  PVar5.first = (Function *)this;
  return PVar5;
}

Assistant:

static Program run(const Program& program) {
		Program new_program;
		FunctionTable function_table;
		for (const Function* function: program) {
			Function* new_function = new Function(function->get_argument_types(), function->get_return_type());
			new_program.add_function(new_function);
			function_table[function] = new_function;
		}
		for (const Function* function: program) {
			Function* new_function = function_table[function];
			UsageTable usage_table;
			UsageAnalysis1::evaluate(usage_table, function->get_block());
			UsageAnalysis2::evaluate(usage_table, function->get_block());
			evaluate(function_table, usage_table, new_function->get_block(), function->get_block());
		}
		return new_program;
	}